

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O1

void __thiscall
SAT::analyze(SAT *this,int nodeid,
            set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  double *pdVar5;
  Clause **ppCVar6;
  Clause *pCVar7;
  _Iter_comp_iter<SAT::LitSort> __comp;
  Lit *pLVar8;
  double dVar9;
  IntVar **ppIVar10;
  bool bVar11;
  int iVar12;
  uint64_t d1;
  long lVar13;
  ulong uVar14;
  anon_union_8_2_743a5d44_for_Reason_0 aVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar19;
  size_t sVar20;
  int iVar21;
  Lit *pLVar22;
  double dVar23;
  Clause *c;
  vec<Lit> out_learnt2;
  anon_union_8_2_743a5d44_for_Reason_0 local_58;
  Lit local_4c;
  vec<Lit> local_48;
  
  psVar19 = (set<int,_std::less<int>,_std::allocator<int>_> *)(ulong)(uint)nodeid;
  this->avg_depth = ((double)(int)((this->trail).sz - 1) - this->avg_depth) * 0.01 + this->avg_depth
  ;
  checkConflict(this);
  dVar9 = this->var_inc * 1.05;
  this->var_inc = dVar9;
  if (1e+100 < dVar9) {
    lVar13 = (long)(int)(this->assigns).sz;
    if (0 < lVar13) {
      pdVar5 = (this->activity).data;
      lVar16 = 0;
      do {
        pdVar5[lVar16] = pdVar5[lVar16] * 1e-100;
        lVar16 = lVar16 + 1;
      } while (lVar13 != lVar16);
    }
    ppIVar10 = engine.vars.data;
    uVar14 = (ulong)engine.vars.sz;
    if (uVar14 != 0) {
      uVar17 = 0;
      do {
        ppIVar10[uVar17]->activity = ppIVar10[uVar17]->activity * 1e-100;
        uVar17 = uVar17 + 1;
      } while (uVar14 != uVar17);
    }
    this->var_inc = this->var_inc * 1e-100;
  }
  dVar9 = this->cla_inc * 1.001;
  this->cla_inc = dVar9;
  if (1e+20 < dVar9) {
    this->cla_inc = dVar9 * 1e-20;
    uVar14 = (ulong)(this->learnts).sz;
    if (uVar14 != 0) {
      ppCVar6 = (this->learnts).data;
      uVar17 = 0;
      do {
        pCVar7 = ppCVar6[uVar17];
        pCVar7->data[*(uint *)pCVar7 >> 8].x =
             (int)((float)pCVar7->data[*(uint *)pCVar7 >> 8].x * 1e-20);
        uVar17 = uVar17 + 1;
      } while (uVar14 != uVar17);
    }
  }
  getLearntClause(this,nodeid,contributingNogoods);
  explainUnlearnable(this,psVar19);
  if (so.exhaustive_activity == true) {
    explainToExhaustion(this,contributingNogoods);
  }
  clearSeen(this);
  iVar12 = findBackTrackLevel(this);
  this->back_jumps = this->back_jumps + (long)(int)(((this->trail).sz - iVar12) + -2);
  btToLevel(this,iVar12);
  this->confl = (Clause *)0x0;
  if ((so.sort_learnt_level == true) && (uVar14 = (ulong)(this->out_learnt).sz, 3 < uVar14)) {
    __comp._M_comp.level = (LitSort)(this->lit_sort).level;
    pLVar22 = (this->out_learnt).data;
    pLVar8 = pLVar22 + uVar14;
    pLVar22 = pLVar22 + 2;
    uVar14 = (long)(uVar14 * 4 + -8) >> 2;
    lVar13 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::__introsort_loop<Lit*,long,__gnu_cxx::__ops::_Iter_comp_iter<SAT::LitSort>>
              (pLVar22,pLVar8,(ulong)(((uint)lVar13 ^ 0x3f) * 2) ^ 0x7e,__comp);
    std::__final_insertion_sort<Lit*,__gnu_cxx::__ops::_Iter_comp_iter<SAT::LitSort>>
              (pLVar22,pLVar8,__comp);
  }
  uVar3 = (this->out_learnt).sz;
  sVar20 = 0x14;
  if (uVar3 != 0) {
    sVar20 = (ulong)(uVar3 - 1) * 4 + 0x14;
  }
  aVar15._pt = (Clause *)malloc(sVar20);
  Clause::Clause<vec<Lit>>(aVar15._pt,&this->out_learnt,true);
  uVar3 = *(uint *)aVar15._pt;
  uVar14 = (ulong)(uVar3 >> 8);
  (aVar15._pt)->data[uVar14].x = (int)(float)this->cla_inc;
  ((Clause *)(aVar15._a + 8))->data[uVar14 - 1].x = 1;
  ((Lit *)(aVar15._a + 0xc))[uVar14].x = nodeid;
  local_58._pt = aVar15._pt;
  if (uVar3 < 0x20000) {
    if (((byte)engine.conflicts & 0xf) == 0) {
      lVar13 = std::chrono::_V2::steady_clock::now();
      dVar9 = exp(((double)((lVar13 - (this->ll_time).__d.__r) / 1000000) / 1000.0) /
                  this->learnt_len_el);
      dVar23 = this->ll_inc * dVar9;
      this->ll_inc = dVar23;
      if (1e+100 < dVar23) {
        pdVar5 = (this->learnt_len_occ).data;
        lVar16 = 0;
        do {
          pdVar1 = pdVar5 + lVar16;
          dVar23 = pdVar1[1];
          pdVar2 = pdVar5 + lVar16;
          *pdVar2 = *pdVar1 * 1e-100;
          pdVar2[1] = dVar23 * 1e-100;
          lVar16 = lVar16 + 2;
        } while (lVar16 != 0x200);
        this->ll_inc = this->ll_inc * 1e-100;
      }
      (this->ll_time).__d.__r = lVar13;
      this->confl_rate = this->confl_rate / dVar9;
    }
    pdVar5 = (this->learnt_len_occ).data;
    pdVar5[uVar14] = this->ll_inc + pdVar5[uVar14];
    this->confl_rate = 1.0 / this->learnt_len_el + this->confl_rate;
  }
  if ((so.learn == true) && (0x1ff < *(uint *)local_58._pt)) {
    addClause(this,local_58._pt,so.one_watch);
  }
  if ((so.learn != true) || ((so.bin_clause_opt == true && (*(uint *)local_58._pt < 0x300)))) {
    vec<Clause_*>::push((this->rtrail).data + ((this->rtrail).sz - 1),&local_58._pt);
  }
  pLVar8 = (this->out_learnt).data;
  aVar15 = local_58;
  if ((so.bin_clause_opt == true) && (((ulong)*local_58._pt & 0xffffff00) == 0x200)) {
    aVar15._pt = (Clause *)((long)pLVar8[1].x * 4 + 2);
  }
  enqueue(this,(Lit)pLVar8->x,(Reason)aVar15);
  if (so.ldsbad == true) {
    local_48.sz = 0;
    local_48.cap = 0;
    local_48.data = (Lit *)0x0;
    vec<Lit>::push(&local_48,(this->out_learnt).data);
    iVar12 = (this->trail).sz - 1;
    if (0 < iVar12) {
      iVar18 = 0;
      iVar21 = 0;
      do {
        local_4c.x = ((this->trail).data[(uint)(iVar12 + iVar18)].data)->x ^ 1;
        vec<Lit>::push(&local_48,&local_4c);
        iVar21 = iVar21 + 1;
        iVar12 = (this->trail).sz - 1;
        iVar18 = iVar18 + -1;
      } while (iVar21 < iVar12);
    }
    uVar3 = local_48.sz;
    uVar14 = local_48._0_8_ & 0xffffffff;
    sVar20 = 0x14;
    if (local_48.sz != 0) {
      sVar20 = (ulong)(local_48.sz - 1) * 4 + 0x14;
    }
    local_58._pt = (Clause *)malloc(sVar20);
    uVar4 = *(uint *)local_58._pt;
    (local_58._pt)->data[0].x = -2;
    *(uint *)local_58._pt = uVar3 * 0x100 + (uVar4 & 0xfc) + 1;
    if (uVar3 != 0) {
      uVar17 = 0;
      do {
        (local_58._pt)->data[uVar17].x = local_48.data[uVar17].x;
        uVar17 = uVar17 + 1;
      } while (uVar14 != uVar17);
    }
    vec<Clause_*>::push((this->rtrail).data + ((this->rtrail).sz - 1),&local_58._pt);
    if (local_48.data != (Lit *)0x0) {
      free(local_48.data);
    }
  }
  if ((so.ldsb == true) && (bVar11 = LDSB::processImpl(&ldsb,local_58._pt), !bVar11)) {
    engine.async_fail = true;
  }
  if ((int)(this->learnts).sz < so.nof_learnts) {
    iVar12 = so.learnts_mlimit + 3;
    if (-1 < so.learnts_mlimit) {
      iVar12 = so.learnts_mlimit;
    }
    if (this->learnts_literals < (long)(iVar12 >> 2)) {
      return;
    }
  }
  reduceDB(this);
  return;
}

Assistant:

void SAT::analyze(int nodeid, std::set<int>& contributingNogoods) {
	avg_depth += 0.01 * (decisionLevel() - avg_depth);

	/* if (so.debug) { */
	/*   std::cerr << "trail:\n"; */
	/*   for (int i = 0 ; i < trail.size() ; i++) { */
	/*     std::cerr << "level " << i << ":"; */
	/*     for (int j = 0 ; j < trail[i].size() ; j++) { */
	/*       Lit& lit = trail[i][j]; */
	/*       std::cerr << " " << getLitString(toInt(lit)); */
	/*     } */
	/*     std::cerr << "\n"; */
	/*   } */
	/* } */

	checkConflict();
	varDecayActivity();
	claDecayActivity();
	getLearntClause(nodeid, contributingNogoods);
	explainUnlearnable(contributingNogoods);
	if (so.exhaustive_activity) {
		explainToExhaustion(contributingNogoods);
	}
	clearSeen();

	const int btlevel = findBackTrackLevel();
	back_jumps += decisionLevel() - 1 - btlevel;
	//	fprintf(stderr, "btlevel = %d\n", btlevel);
	btToLevel(btlevel);
	confl = nullptr;

	if (so.sort_learnt_level && out_learnt.size() >= 4) {
		std::sort((Lit*)out_learnt + 2, (Lit*)out_learnt + out_learnt.size(), lit_sort);
	}

#if DEBUG_VERBOSE
	std::cerr << "out_learnt:";
	for (int i = 0; i < out_learnt.size(); i++) {
		std::cerr << " " << toInt(out_learnt[i]);
	}
	std::cerr << "\n";
	std::cerr << "out_learnt (interpreted):";
	for (int i = 0; i < out_learnt.size(); i++) {
		std::cerr << " " << litString[toInt(out_learnt[i])];
	}
	std::cerr << "\n";
#endif

	Clause* c = Clause_new(out_learnt, true);
	c->activity() = static_cast<float>(cla_inc);
	c->rawActivity() = 1;
	c->clauseID() = nodeid;

	learntLenBumpActivity(c->size());

	/* std::cerr << "conflict found clause of length " << c->size() << "\n"; */

	/* if (c->size() == 1) { */
	/*     std::cerr << "learntfact: " << getLitString(toInt((*c)[0])) << "\n"; */
	/* } */

	if (so.learn && c->size() >= 2) {
		addClause(*c, so.one_watch);
	}

	if (!so.learn || (so.bin_clause_opt && c->size() <= 2)) {
		rtrail.last().push(c);
	}

	enqueue(out_learnt[0], (so.bin_clause_opt && c->size() == 2) ? Reason(out_learnt[1]) : c);

	if (PRINT_ANALYSIS) {
		printClause(*c);
	}

	if (so.ldsbad) {
		vec<Lit> out_learnt2;
		out_learnt2.push(out_learnt[0]);
		for (int i = 0; i < decisionLevel(); i++) {
			out_learnt2.push(~decLit(decisionLevel() - i));
		}
		c = Clause_new(out_learnt2, true);
		rtrail.last().push(c);
	}

	if (so.ldsb && !ldsb.processImpl(c)) {
		engine.async_fail = true;
	}

	if (static_cast<int>(learnts.size()) >= so.nof_learnts ||
			learnts_literals >= so.learnts_mlimit / 4) {
		reduceDB();
	}
}